

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_
          (string *__return_storage_ptr__,CSVReaderOptions *this)

{
  _Base_ptr p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (p_Var1 = (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var1 !=
        &(this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var1 + 1),"=");
    ::std::operator+(&local_50,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var1 + 2));
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string CSVReaderOptions::GetUserDefinedParameters() const {
	string result;
	for (auto &udf_parameter : user_defined_parameters) {
		if (!result.empty()) {
			result += ", ";
		}
		result += udf_parameter.first + "=" + udf_parameter.second;
	}
	return result;
}